

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser-basetype.cc
# Opt level: O3

bool __thiscall
tinyusdz::ascii::AsciiParser::ReadBasicType
          (AsciiParser *this,optional<tinyusdz::value::color4d> *value)

{
  bool bVar1;
  double4 v;
  array<double,_4UL> local_38;
  
  bVar1 = MaybeNone(this);
  if (bVar1) {
    value->has_value_ = false;
    bVar1 = true;
  }
  else {
    bVar1 = ParseBasicTypeTuple<double,4ul>(this,&local_38);
    if (bVar1) {
      *(double *)&value->contained = local_38._M_elems[0];
      *(double *)((long)&value->contained + 8) = local_38._M_elems[1];
      *(double *)((long)&value->contained + 0x10) = local_38._M_elems[2];
      *(double *)((long)&value->contained + 0x18) = local_38._M_elems[3];
      bVar1 = true;
      if (value->has_value_ == false) {
        value->has_value_ = true;
      }
    }
    else {
      bVar1 = false;
    }
  }
  return bVar1;
}

Assistant:

bool AsciiParser::ReadBasicType(nonstd::optional<value::color4d> *value) {
  if (MaybeNone()) {
    (*value) = nonstd::nullopt;
    return true;
  }

  value::color4d v;
  if (ReadBasicType(&v)) {
    (*value) = v;
    return true;
  }

  return false;
}